

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectWindowRewriteExprCb(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  Parse *pParse;
  WindowRewrite *pWVar4;
  Table *pTVar5;
  Expr *pExpr_00;
  ExprList *pEVar6;
  WindowRewrite *pWVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  
  pParse = pWalker->pParse;
  pWVar4 = (pWalker->u).pRewrite;
  bVar2 = pExpr->op;
  if (pWVar4->pSubSelect == (Select *)0x0) {
LAB_0016e047:
    if (bVar2 - 0x9e < 2) {
LAB_0016e052:
      pExpr_00 = sqlite3ExprDup(pParse->db,pExpr,0);
      pEVar6 = sqlite3ExprListAppend(pParse,pWVar4->pSub,pExpr_00);
      pWVar4->pSub = pEVar6;
      iVar9 = 0;
      if (pEVar6 != (ExprList *)0x0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 1);
        *pbVar1 = *pbVar1 | 0x80;
        sqlite3ExprDeleteNN(pParse->db,pExpr);
        pExpr->op = '\0';
        pExpr->affinity = '\0';
        *(undefined2 *)&pExpr->field_0x2 = 0;
        pExpr->flags = 0;
        (pExpr->u).zToken = (char *)0x0;
        pExpr->iColumn = 0;
        pExpr->iAgg = 0;
        pExpr->iRightJoinTable = 0;
        pExpr->op2 = '\0';
        pExpr->field_0x37 = 0;
        pExpr->pAggInfo = (AggInfo *)0x0;
        (pExpr->x).pList = (ExprList *)0x0;
        pExpr->nHeight = 0;
        pExpr->iTable = 0;
        pExpr->pLeft = (Expr *)0x0;
        pExpr->pRight = (Expr *)0x0;
        (pExpr->y).pTab = (Table *)0x0;
        pExpr->op = 0x9e;
        pExpr->iColumn = (short)pWVar4->pSub->nExpr + -1;
        pExpr->iTable = pWVar4->pWin->iEphCsr;
        iVar9 = 0;
      }
    }
    else {
      iVar9 = 0;
      if ((bVar2 == 0x9d) && ((pExpr->flags & 0x1000000) != 0)) {
        iVar9 = 1;
        pWVar7 = pWVar4;
        do {
          pTVar5 = (Table *)pWVar7->pWin;
          if (pTVar5 == (Table *)0x0) goto LAB_0016e052;
          pWVar7 = (WindowRewrite *)&pTVar5->pCheck;
        } while ((pExpr->y).pTab != pTVar5);
      }
    }
  }
  else {
    if (bVar2 == 0x9e) {
      uVar3 = pWVar4->pSrc->nSrc;
      uVar10 = 0;
      uVar8 = 0;
      if (0 < (int)uVar3) {
        uVar8 = (ulong)uVar3;
      }
      piVar11 = &pWVar4->pSrc->a[0].iCursor;
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if (pExpr->iTable == *piVar11) {
          uVar8 = uVar10 & 0xffffffff;
          break;
        }
        piVar11 = piVar11 + 0x1c;
      }
      if ((uint)uVar8 != uVar3) goto LAB_0016e047;
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int selectWindowRewriteExprCb(Walker *pWalker, Expr *pExpr){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Parse *pParse = pWalker->pParse;

  /* If this function is being called from within a scalar sub-select
  ** that used by the SELECT statement being processed, only process
  ** TK_COLUMN expressions that refer to it (the outer SELECT). Do
  ** not process aggregates or window functions at all, as they belong
  ** to the scalar sub-select.  */
  if( p->pSubSelect ){
    if( pExpr->op!=TK_COLUMN ){
      return WRC_Continue;
    }else{
      int nSrc = p->pSrc->nSrc;
      int i;
      for(i=0; i<nSrc; i++){
        if( pExpr->iTable==p->pSrc->a[i].iCursor ) break;
      }
      if( i==nSrc ) return WRC_Continue;
    }
  }

  switch( pExpr->op ){

    case TK_FUNCTION:
      if( !ExprHasProperty(pExpr, EP_WinFunc) ){
        break;
      }else{
        Window *pWin;
        for(pWin=p->pWin; pWin; pWin=pWin->pNextWin){
          if( pExpr->y.pWin==pWin ){
            assert( pWin->pOwner==pExpr );
            return WRC_Prune;
          }
        }
      }
      /* Fall through.  */

    case TK_AGG_FUNCTION:
    case TK_COLUMN: {
      Expr *pDup = sqlite3ExprDup(pParse->db, pExpr, 0);
      p->pSub = sqlite3ExprListAppend(pParse, p->pSub, pDup);
      if( p->pSub ){
        assert( ExprHasProperty(pExpr, EP_Static)==0 );
        ExprSetProperty(pExpr, EP_Static);
        sqlite3ExprDelete(pParse->db, pExpr);
        ExprClearProperty(pExpr, EP_Static);
        memset(pExpr, 0, sizeof(Expr));

        pExpr->op = TK_COLUMN;
        pExpr->iColumn = p->pSub->nExpr-1;
        pExpr->iTable = p->pWin->iEphCsr;
      }

      break;
    }

    default: /* no-op */
      break;
  }

  return WRC_Continue;
}